

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_capabilities.cpp
# Opt level: O2

void __thiscall
pfederc::Parser::parseCapabilityEnsure
          (Parser *this,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *requires,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *ensures)

{
  Lexer *pLVar1;
  Token *this_00;
  bool bVar2;
  ulong uVar3;
  char cVar4;
  undefined2 local_62;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined4 local_3c;
  
  sanityExpect(this,TOK_ENSURE);
  pLVar1 = this->lexer;
  this_00 = pLVar1->currentToken;
  bVar2 = Token::operator!=(this_00,TOK_ID);
  if (!bVar2) {
    (*this_00->_vptr_Token[2])(&local_60,this_00,pLVar1);
    bVar2 = std::operator==(&local_60,"ensures");
    cVar4 = '\x01';
    if (!bVar2) {
      bVar2 = std::operator==(&local_60,"requires");
      cVar4 = bVar2 * '\x02';
    }
    std::__cxx11::string::~string((string *)&local_60);
    if (cVar4 != '\0') {
      Lexer::next(this->lexer);
      if (cVar4 == '\x01') {
        requires = ensures;
      }
      bVar2 = false;
      goto LAB_0010ea55;
    }
  }
  local_62 = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
  local_3c = 0x27;
  std::
  make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
            ((Level *)&local_60,(SyntaxErrorCode *)&local_62,(Position *)&local_3c);
  generateError((Parser *)&stack0xffffffffffffffc8,
                (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                 *)this);
  std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
             &stack0xffffffffffffffc8);
  std::
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                 *)&local_60);
  uVar3 = (ulong)this->lexer->currentToken->type;
  bVar2 = true;
  if ((0x2c < uVar3) || ((0x100000000006U >> (uVar3 & 0x3f) & 1) == 0)) {
    Lexer::next(this->lexer);
  }
LAB_0010ea55:
  parseExpression((Parser *)&local_60,(Precedence)this);
  if ((long *)local_60._M_dataplus._M_p != (long *)0x0 && !bVar2) {
    std::
    vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
    ::emplace_back<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
              ((vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
                *)requires,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_60);
  }
  if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
  }
  return;
}

Assistant:

void Parser::parseCapabilityEnsure(std::vector<std::unique_ptr<Expr>> &requires,
    std::vector<std::unique_ptr<Expr>> &ensures) noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_ENSURE);

  bool err = false;

  const Token *const tokCmd = lexer.getCurrentToken();
  uint8_t capstype = _CAPS_ENSURE_INVALID;
  if ((capstype = _getCapsEnsure(tokCmd, getLexer())) == _CAPS_ENSURE_INVALID) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_CAPS_ENSURE, lexer.getCurrentToken()->getPosition()));
    switch (lexer.getCurrentToken()->getType()) {
    case TokenType::TOK_EOF:
    case TokenType::TOK_EOL:
    case TokenType::TOK_STMT:
      break;
    default:
      lexer.next();
      break;
    }

    err = true;
  } else {
    lexer.next();
  }

  std::unique_ptr<Expr> expr(parseExpression());
  if (!expr)
    err = true;

  if (err)
    return;

  if (capstype == _CAPS_ENSURE_ENSURES)
    ensures.push_back(std::move(expr));
  else
    requires.push_back(std::move(expr));
}